

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputeProperty.cpp
# Opt level: O1

float Rml::ComputeAngle(NumericValue value)

{
  code *pcVar1;
  bool bVar2;
  float fVar3;
  
  fVar3 = value.number;
  if (((ulong)value >> 0x20 != 0x10) && (value.unit != RAD)) {
    if (value.unit == DEG) {
      fVar3 = Math::DegreesToRadians(fVar3);
      return fVar3;
    }
    bVar2 = Assert("RMLUI_ERROR",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ComputeProperty.cpp"
                   ,0x6f);
    fVar3 = 0.0;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return fVar3;
}

Assistant:

float ComputeAngle(NumericValue value)
{
	switch (value.unit)
	{
	case Unit::NUMBER:
	case Unit::RAD: return value.number;

	case Unit::DEG: return Math::DegreesToRadians(value.number);
	default: break;
	}

	RMLUI_ERROR;
	return 0.0f;
}